

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool cmGetPropertyCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  bool source_file_directory_option_enabled;
  PolicyStatus PVar5;
  cmState *pcVar6;
  cmPropertyDefinition *pcVar7;
  cmTarget *this;
  cmTest *this_00;
  cmSourceFile *this_01;
  cmake *pcVar8;
  cmInstalledFile *this_02;
  string *psVar9;
  cmGlobalGenerator *pcVar10;
  cmMakefile *this_03;
  pointer value;
  cmValue cVar11;
  char *pcVar12;
  _Alloc_hider value_00;
  PolicyID id;
  ScopeType scope;
  int iVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_04;
  string *psVar14;
  ulong uVar15;
  int iVar16;
  cmMakefile *pcVar17;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  OutType local_18c;
  string output;
  string name;
  string source_file_absolute_path;
  string propertyName;
  cmAlphaNum local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  string local_50;
  
  psVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar14) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"called with incorrect number of arguments",
               (allocator<char> *)&local_d8);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&output);
    return false;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  propertyName._M_dataplus._M_p = (pointer)&propertyName.field_2;
  propertyName._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  propertyName.field_2._M_local_buf[0] = '\0';
  source_file_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_file_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  source_file_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  source_file_target_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_file_target_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  source_file_target_directories.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = std::operator==(psVar14 + 1,"GLOBAL");
  scope = GLOBAL;
  iVar16 = 1;
  uVar15 = 2;
  bVar2 = 0;
  if (!bVar3) {
    bVar3 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"DIRECTORY");
    scope = TARGET;
    if (bVar3) {
      bVar2 = 0;
      scope = DIRECTORY;
      goto LAB_001cedc3;
    }
    bVar3 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"TARGET");
    if (bVar3) goto LAB_001ced83;
    bVar3 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"SOURCE");
    bVar2 = 1;
    scope = SOURCE_FILE;
    if (bVar3) goto LAB_001cedc3;
    bVar3 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"TEST");
    if (bVar3) {
      scope = TEST;
LAB_001cedc2:
      bVar2 = 0;
      goto LAB_001cedc3;
    }
    bVar3 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"VARIABLE");
    if (bVar3) {
      scope = VARIABLE;
LAB_001ced83:
      bVar2 = 0;
      goto LAB_001cedc3;
    }
    bVar3 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"CACHE");
    if (bVar3) {
      scope = CACHE;
      goto LAB_001cedc2;
    }
    bVar3 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,"INSTALL");
    if (bVar3) {
      scope = INSTALL;
      goto LAB_001ced83;
    }
    output._M_dataplus._M_p = (pointer)0x14;
    output._M_string_length = (size_type)anon_var_dwarf_2bfae3;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_d8.View_._M_str = pbVar1[1]._M_dataplus._M_p;
    local_d8.View_._M_len = pbVar1[1]._M_string_length;
    cmStrCat<char[87]>(&source_file_absolute_path,(cmAlphaNum *)&output,&local_d8,
                       (char (*) [87])
                       ".  Valid scopes are GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."
                      );
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001cf608:
    psVar14 = &source_file_absolute_path;
LAB_001cf0ee:
    std::__cxx11::string::~string((string *)psVar14);
    bVar4 = false;
    goto LAB_001cf8f5;
  }
LAB_001cedc3:
  local_18c = OutValue;
  bVar3 = false;
  source_file_directory_option_enabled = false;
  for (; pbVar1 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
      uVar15 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar15 = (ulong)((int)uVar15 + 1)) {
    bVar4 = std::operator==(pbVar1 + uVar15,"PROPERTY");
    if (bVar4) {
      iVar16 = 2;
    }
    else {
      bVar4 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar15,"BRIEF_DOCS");
      iVar13 = 0;
      if (bVar4) {
        local_18c = OutBriefDoc;
        iVar16 = iVar13;
      }
      else {
        bVar4 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar15,"FULL_DOCS");
        if (bVar4) {
          local_18c = OutFullDoc;
          iVar16 = iVar13;
        }
        else {
          bVar4 = std::operator==((args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start + uVar15,"SET");
          if (bVar4) {
            local_18c = OutSet;
            iVar16 = iVar13;
          }
          else {
            bVar4 = std::operator==((args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar15,"DEFINED");
            if (bVar4) {
              local_18c = OutDefined;
              iVar16 = iVar13;
            }
            else {
              psVar9 = &name;
              if (iVar16 == 1) {
LAB_001cef23:
                std::__cxx11::string::_M_assign((string *)psVar9);
                iVar16 = 0;
              }
              else if (iVar16 != 0 || (bool)(bVar2 ^ 1)) {
                psVar9 = &propertyName;
                if (iVar16 == 2) goto LAB_001cef23;
                this_04 = &source_file_directories;
                if (iVar16 != 4) {
                  if (iVar16 != 5) goto LAB_001cef59;
                  this_04 = &source_file_target_directories;
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(this_04,(args->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar15);
                iVar16 = 0;
              }
              else {
                bVar4 = std::operator==((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar15,
                                        "DIRECTORY");
                if (bVar4) {
                  source_file_directory_option_enabled = true;
                  iVar16 = 4;
                }
                else {
                  bVar4 = std::operator==((args->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + uVar15,
                                          "TARGET_DIRECTORY");
                  bVar3 = true;
                  iVar16 = 5;
                  if (!bVar4) {
LAB_001cef59:
                    output._M_dataplus._M_p = &DAT_00000018;
                    output._M_string_length = (size_type)anon_var_dwarf_2bfb68;
                    pbVar1 = (args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    local_d8.View_._M_str = pbVar1[uVar15]._M_dataplus._M_p;
                    local_d8.View_._M_len = pbVar1[uVar15]._M_string_length;
                    cmStrCat<char[3]>(&source_file_absolute_path,(cmAlphaNum *)&output,&local_d8,
                                      (char (*) [3])0x5a1934);
                    std::__cxx11::string::_M_assign((string *)&status->Error);
                    goto LAB_001cf608;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (propertyName._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"not given a PROPERTY <name> argument.",
               (allocator<char> *)&local_d8);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    psVar14 = &output;
    goto LAB_001cf0ee;
  }
  source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  source_file_directory_makefiles.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                    (status,source_file_directory_option_enabled,bVar3,&source_file_directories,
                     &source_file_target_directories,&source_file_directory_makefiles);
  if (!bVar4) goto LAB_001cf8e5;
  if (local_18c == OutDefined) {
    pcVar6 = cmMakefile::GetState(status->Makefile);
    pcVar7 = cmState::GetPropertyDefinition(pcVar6,&propertyName,scope);
    pcVar12 = "1";
    if (pcVar7 == (cmPropertyDefinition *)0x0) {
      pcVar12 = "0";
    }
    bVar4 = true;
    value_03._M_str = pcVar12;
    value_03._M_len = 1;
    cmMakefile::AddDefinition(status->Makefile,psVar14,value_03);
    goto switchD_001cf1e3_caseD_7;
  }
  if (local_18c == OutFullDoc) {
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    pcVar6 = cmMakefile::GetState(status->Makefile);
    pcVar7 = cmState::GetPropertyDefinition(pcVar6,&propertyName,scope);
    if (pcVar7 != (cmPropertyDefinition *)0x0) {
      std::__cxx11::string::_M_assign((string *)&output);
    }
    if (output._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&output);
    }
    value_02._M_str = output._M_dataplus._M_p;
    value_02._M_len = output._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,psVar14,value_02);
LAB_001cf16e:
    std::__cxx11::string::~string((string *)&output);
    bVar4 = true;
    goto switchD_001cf1e3_caseD_7;
  }
  if (local_18c == OutBriefDoc) {
    output._M_dataplus._M_p = (pointer)&output.field_2;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    pcVar6 = cmMakefile::GetState(status->Makefile);
    pcVar7 = cmState::GetPropertyDefinition(pcVar6,&propertyName,scope);
    if (pcVar7 != (cmPropertyDefinition *)0x0) {
      std::__cxx11::string::_M_assign((string *)&output);
    }
    if (output._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&output);
    }
    value_01._M_str = output._M_dataplus._M_p;
    value_01._M_len = output._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,psVar14,value_01);
    goto LAB_001cf16e;
  }
  bVar4 = true;
  switch(scope) {
  case TARGET:
    if (name._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"not given name for TARGET scope.",(allocator<char> *)&local_d8);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001cf8db;
    }
    this = cmMakefile::FindTargetToUse(status->Makefile,&name,false);
    if (this != (cmTarget *)0x0) {
      bVar3 = std::operator==(&propertyName,"ALIASED_TARGET");
      if ((!bVar3) && (bVar3 = std::operator==(&propertyName,"ALIAS_GLOBAL"), !bVar3)) {
        cVar11 = cmTarget::GetComputedProperty(this,&propertyName,status->Makefile);
        if (cVar11.Value == (string *)0x0) {
          cVar11 = cmTarget::GetProperty(this,&propertyName);
        }
        goto LAB_001cf96e;
      }
      bVar3 = cmMakefile::IsAlias(status->Makefile,&name);
      if (bVar3) {
        bVar3 = std::operator==(&propertyName,"ALIASED_TARGET");
        if (bVar3) {
          pcVar17 = status->Makefile;
          psVar9 = cmTarget::GetName_abi_cxx11_(this);
          value = (psVar9->_M_dataplus)._M_p;
          goto LAB_001cf4df;
        }
        bVar3 = std::operator==(&propertyName,"ALIAS_GLOBAL");
        if (bVar3) {
          pcVar17 = status->Makefile;
          pcVar10 = cmMakefile::GetGlobalGenerator(pcVar17);
          bVar3 = cmGlobalGenerator::IsAlias(pcVar10,&name);
          pcVar12 = "FALSE";
          if (bVar3) {
            pcVar12 = "TRUE";
          }
          (anonymous_namespace)::StoreResult<char_const*>(local_18c,pcVar17,psVar14,pcVar12);
          goto switchD_001cf1e3_caseD_7;
        }
      }
      pcVar17 = status->Makefile;
      cVar11.Value = (string *)0x0;
      break;
    }
    output._M_dataplus._M_p = (pointer)0x16;
    output._M_string_length = (size_type)anon_var_dwarf_45f8de;
    local_d8.View_._M_len = name._M_string_length;
    local_d8.View_._M_str = name._M_dataplus._M_p;
    cmStrCat<char[40]>(&source_file_absolute_path,(cmAlphaNum *)&output,&local_d8,
                       (char (*) [40])".  Perhaps it has not yet been created.");
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001cf893:
    psVar14 = &source_file_absolute_path;
    goto LAB_001cf8e0;
  case SOURCE_FILE:
    if (name._M_string_length != 0) {
      pcVar17 = *source_file_directory_makefiles.
                 super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded
                (&source_file_absolute_path,status,&name,
                 (bool)(bVar3 | source_file_directory_option_enabled));
      this_01 = cmMakefile::GetOrCreateSource(pcVar17,&source_file_absolute_path,false,Ambiguous);
      bVar4 = this_01 != (cmSourceFile *)0x0;
      if (this_01 == (cmSourceFile *)0x0) {
        output._M_dataplus._M_p = (pointer)0x36;
        output._M_string_length = (size_type)anon_var_dwarf_45f91e;
        local_d8.View_._M_len = source_file_absolute_path._M_string_length;
        local_d8.View_._M_str = source_file_absolute_path._M_dataplus._M_p;
        cmStrCat<>(&local_50,(cmAlphaNum *)&output,&local_d8);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        pcVar17 = status->Makefile;
        cVar11 = cmSourceFile::GetPropertyForUser(this_01,&propertyName);
        anon_unknown.dwarf_45f9e8::StoreResult<cmValue>(local_18c,pcVar17,psVar14,cVar11);
      }
      psVar14 = &source_file_absolute_path;
LAB_001cf94c:
      std::__cxx11::string::~string((string *)psVar14);
      goto switchD_001cf1e3_caseD_7;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"not given name for SOURCE scope.",(allocator<char> *)&local_d8);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_001cf8db;
  case DIRECTORY:
    this_03 = status->Makefile;
    if (name._M_string_length != 0) {
      psVar9 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_03);
      cmsys::SystemTools::CollapseFullPath(&output,&name,psVar9);
      pcVar10 = cmMakefile::GetGlobalGenerator(status->Makefile);
      this_03 = cmGlobalGenerator::FindMakefile(pcVar10,&output);
      if (this_03 == (cmMakefile *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d8,
                   "DIRECTORY scope provided but requested directory was not found. This could be because the directory argument was invalid or, it is valid but has not been processed yet."
                   ,(allocator<char> *)&source_file_absolute_path);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&local_d8);
        goto LAB_001cf8db;
      }
      std::__cxx11::string::~string((string *)&output);
    }
    bVar3 = std::operator==(&propertyName,"DEFINITIONS");
    if (bVar3) {
      PVar5 = cmMakefile::GetPolicyStatus(this_03,CMP0059,false);
      if (PVar5 != OLD) {
        if (PVar5 != WARN) goto LAB_001cf59d;
        cmPolicies::GetPolicyWarning_abi_cxx11_(&output,(cmPolicies *)0x3b,id);
        cmMakefile::IssueMessage(this_03,AUTHOR_WARNING,&output);
        std::__cxx11::string::~string((string *)&output);
      }
      pcVar17 = status->Makefile;
      value = cmMakefile::GetDefineFlagsCMP0059(this_03);
LAB_001cf4df:
      (anonymous_namespace)::StoreResult<char_const*>(local_18c,pcVar17,psVar14,value);
      goto switchD_001cf1e3_caseD_7;
    }
LAB_001cf59d:
    pcVar17 = status->Makefile;
    cVar11 = cmMakefile::GetProperty(this_03,&propertyName);
    break;
  case GLOBAL:
    if (name._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"given name for GLOBAL scope.",(allocator<char> *)&local_d8);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001cf8db;
    }
    pcVar8 = cmMakefile::GetCMakeInstance(status->Makefile);
    pcVar17 = status->Makefile;
    cVar11 = cmState::GetGlobalProperty
                       ((pcVar8->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&propertyName);
    break;
  case CACHE:
    if (name._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"not given name for CACHE scope.",(allocator<char> *)&local_d8);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001cf8db;
    }
    pcVar6 = cmMakefile::GetState(status->Makefile);
    cVar11 = cmState::GetCacheEntryValue(pcVar6,&name);
    if (cVar11.Value == (string *)0x0) {
      cVar11.Value = (string *)0x0;
    }
    else {
      pcVar6 = cmMakefile::GetState(status->Makefile);
      cVar11 = cmState::GetCacheEntryProperty(pcVar6,&name,&propertyName);
    }
LAB_001cf96e:
    pcVar17 = status->Makefile;
    break;
  case TEST:
    if (name._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"not given name for TEST scope.",(allocator<char> *)&local_d8);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001cf8db;
    }
    this_00 = cmMakefile::GetTest(status->Makefile,&name);
    if (this_00 == (cmTest *)0x0) {
      output._M_dataplus._M_p = (pointer)0x25;
      output._M_string_length = (size_type)anon_var_dwarf_45f952;
      local_d8.View_._M_len = name._M_string_length;
      local_d8.View_._M_str = name._M_dataplus._M_p;
      cmStrCat<>(&source_file_absolute_path,(cmAlphaNum *)&output,&local_d8);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001cf893;
    }
    pcVar17 = status->Makefile;
    cVar11 = cmTest::GetProperty(this_00,&propertyName);
    break;
  case VARIABLE:
    if (name._M_string_length != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"given name for VARIABLE scope.",(allocator<char> *)&local_d8);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_001cf8db;
    }
    pcVar17 = status->Makefile;
    cVar11 = cmMakefile::GetDefinition(pcVar17,&propertyName);
    break;
  default:
    goto switchD_001cf1e3_caseD_7;
  case INSTALL:
    if (name._M_string_length != 0) {
      pcVar8 = cmMakefile::GetCMakeInstance(status->Makefile);
      this_02 = cmake::GetOrCreateInstalledFile(pcVar8,status->Makefile,&name);
      if (this_02 == (cmInstalledFile *)0x0) {
        output._M_dataplus._M_p = (pointer)0x37;
        output._M_string_length = (size_type)anon_var_dwarf_45f99e;
        local_d8.View_._M_len = name._M_string_length;
        local_d8.View_._M_str = name._M_dataplus._M_p;
        cmStrCat<>(&source_file_absolute_path,(cmAlphaNum *)&output,&local_d8);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        goto LAB_001cf893;
      }
      output._M_dataplus._M_p = (pointer)&output.field_2;
      output._M_string_length = 0;
      output.field_2._M_local_buf[0] = '\0';
      bVar3 = cmInstalledFile::GetProperty(this_02,&propertyName,&output);
      value_00._M_p = output._M_dataplus._M_p;
      if (!bVar3) {
        value_00._M_p = (char *)0x0;
      }
      (anonymous_namespace)::StoreResult<char_const*>
                (local_18c,status->Makefile,psVar14,value_00._M_p);
      psVar14 = &output;
      goto LAB_001cf94c;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&output,"not given name for INSTALL scope.",(allocator<char> *)&local_d8);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_001cf8db:
    psVar14 = &output;
LAB_001cf8e0:
    std::__cxx11::string::~string((string *)psVar14);
LAB_001cf8e5:
    bVar4 = false;
    goto switchD_001cf1e3_caseD_7;
  }
  anon_unknown.dwarf_45f9e8::StoreResult<cmValue>(local_18c,pcVar17,psVar14,cVar11);
switchD_001cf1e3_caseD_7:
  std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
            (&source_file_directory_makefiles.
              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
LAB_001cf8f5:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&source_file_target_directories);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&source_file_directories);
  std::__cxx11::string::~string((string *)&propertyName);
  std::__cxx11::string::~string((string *)&name);
  return bVar4;
}

Assistant:

bool cmGetPropertyCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  OutType infoType = OutValue;
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // The cmake variable in which to store the result.
  std::string const& variable = args[0];

  std::string name;
  std::string propertyName;

  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;

  // Get the scope from which to get the property.
  cmProperty::ScopeType scope;
  if (args[1] == "GLOBAL") {
    scope = cmProperty::GLOBAL;
  } else if (args[1] == "DIRECTORY") {
    scope = cmProperty::DIRECTORY;
  } else if (args[1] == "TARGET") {
    scope = cmProperty::TARGET;
  } else if (args[1] == "SOURCE") {
    scope = cmProperty::SOURCE_FILE;
  } else if (args[1] == "TEST") {
    scope = cmProperty::TEST;
  } else if (args[1] == "VARIABLE") {
    scope = cmProperty::VARIABLE;
  } else if (args[1] == "CACHE") {
    scope = cmProperty::CACHE;
  } else if (args[1] == "INSTALL") {
    scope = cmProperty::INSTALL;
  } else {
    status.SetError(cmStrCat(
      "given invalid scope ", args[1],
      ".  "
      "Valid scopes are "
      "GLOBAL, DIRECTORY, TARGET, SOURCE, TEST, VARIABLE, CACHE, INSTALL."));
    return false;
  }

  // Parse remaining arguments.
  enum Doing
  {
    DoingNone,
    DoingName,
    DoingProperty,
    DoingType,
    DoingSourceDirectory,
    DoingSourceTargetDirectory
  };
  Doing doing = DoingName;
  for (unsigned int i = 2; i < args.size(); ++i) {
    if (args[i] == "PROPERTY") {
      doing = DoingProperty;
    } else if (args[i] == "BRIEF_DOCS") {
      doing = DoingNone;
      infoType = OutBriefDoc;
    } else if (args[i] == "FULL_DOCS") {
      doing = DoingNone;
      infoType = OutFullDoc;
    } else if (args[i] == "SET") {
      doing = DoingNone;
      infoType = OutSet;
    } else if (args[i] == "DEFINED") {
      doing = DoingNone;
      infoType = OutDefined;
    } else if (doing == DoingName) {
      doing = DoingNone;
      name = args[i];
    } else if (doing == DoingNone && scope == cmProperty::SOURCE_FILE &&
               args[i] == "DIRECTORY") {
      doing = DoingSourceDirectory;
      source_file_directory_option_enabled = true;
    } else if (doing == DoingNone && scope == cmProperty::SOURCE_FILE &&
               args[i] == "TARGET_DIRECTORY") {
      doing = DoingSourceTargetDirectory;
      source_file_target_option_enabled = true;
    } else if (doing == DoingSourceDirectory) {
      source_file_directories.push_back(args[i]);
      doing = DoingNone;
    } else if (doing == DoingSourceTargetDirectory) {
      source_file_target_directories.push_back(args[i]);
      doing = DoingNone;
    } else if (doing == DoingProperty) {
      doing = DoingNone;
      propertyName = args[i];
    } else {
      status.SetError(cmStrCat("given invalid argument \"", args[i], "\"."));
      return false;
    }
  }

  // Make sure a property name was found.
  if (propertyName.empty()) {
    status.SetError("not given a PROPERTY <name> argument.");
    return false;
  }

  std::vector<cmMakefile*> source_file_directory_makefiles;
  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }

  // Compute requested output.
  if (infoType == OutBriefDoc) {
    // Lookup brief documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                                 scope)) {
      output = def->GetShortDescription();
    }
    if (output.empty()) {
      output = "NOTFOUND";
    }
    status.GetMakefile().AddDefinition(variable, output);
  } else if (infoType == OutFullDoc) {
    // Lookup full documentation.
    std::string output;
    if (cmPropertyDefinition const* def =
          status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                                 scope)) {
      output = def->GetFullDescription();
    }
    if (output.empty()) {
      output = "NOTFOUND";
    }
    status.GetMakefile().AddDefinition(variable, output);
  } else if (infoType == OutDefined) {
    // Lookup if the property is defined
    if (status.GetMakefile().GetState()->GetPropertyDefinition(propertyName,
                                                               scope)) {
      status.GetMakefile().AddDefinition(variable, "1");
    } else {
      status.GetMakefile().AddDefinition(variable, "0");
    }
  } else {
    // Dispatch property getting.
    cmMakefile& directory_scope_mf = *(source_file_directory_makefiles[0]);
    bool source_file_paths_should_be_absolute =
      source_file_directory_option_enabled ||
      source_file_target_option_enabled;

    switch (scope) {
      case cmProperty::GLOBAL:
        return HandleGlobalMode(status, name, infoType, variable,
                                propertyName);
      case cmProperty::DIRECTORY:
        return HandleDirectoryMode(status, name, infoType, variable,
                                   propertyName);
      case cmProperty::TARGET:
        return HandleTargetMode(status, name, infoType, variable,
                                propertyName);
      case cmProperty::SOURCE_FILE:
        return HandleSourceMode(status, name, infoType, variable, propertyName,
                                directory_scope_mf,
                                source_file_paths_should_be_absolute);
      case cmProperty::TEST:
        return HandleTestMode(status, name, infoType, variable, propertyName);
      case cmProperty::VARIABLE:
        return HandleVariableMode(status, name, infoType, variable,
                                  propertyName);
      case cmProperty::CACHE:
        return HandleCacheMode(status, name, infoType, variable, propertyName);
      case cmProperty::INSTALL:
        return HandleInstallMode(status, name, infoType, variable,
                                 propertyName);

      case cmProperty::CACHED_VARIABLE:
        break; // should never happen
    }
  }

  return true;
}